

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall
ODDLParser::OpenDDLExport::writeValueType
          (OpenDDLExport *this,ValueType type,size_t numItems,string *statement)

{
  char *__s;
  char acStack_168 [8];
  char buffer [256];
  allocator<char> local_51;
  string local_50 [8];
  string typeStr;
  string *statement_local;
  size_t numItems_local;
  ValueType type_local;
  OpenDDLExport *this_local;
  
  if (type == ddl_types_max) {
    this_local._7_1_ = false;
  }
  else {
    typeStr.field_2._8_8_ = statement;
    __s = getTypeToken(type);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,__s,&local_51);
    std::allocator<char>::~allocator(&local_51);
    std::__cxx11::string::operator+=((string *)typeStr.field_2._8_8_,local_50);
    if (1 < numItems) {
      std::__cxx11::string::operator+=((string *)typeStr.field_2._8_8_,"[");
      buffer[0xe8] = '\0';
      buffer[0xe9] = '\0';
      buffer[0xea] = '\0';
      buffer[0xeb] = '\0';
      buffer[0xec] = '\0';
      buffer[0xed] = '\0';
      buffer[0xee] = '\0';
      buffer[0xef] = '\0';
      buffer[0xf0] = '\0';
      buffer[0xf1] = '\0';
      buffer[0xf2] = '\0';
      buffer[0xf3] = '\0';
      buffer[0xf4] = '\0';
      buffer[0xf5] = '\0';
      buffer[0xf6] = '\0';
      buffer[0xf7] = '\0';
      buffer[0xd8] = '\0';
      buffer[0xd9] = '\0';
      buffer[0xda] = '\0';
      buffer[0xdb] = '\0';
      buffer[0xdc] = '\0';
      buffer[0xdd] = '\0';
      buffer[0xde] = '\0';
      buffer[0xdf] = '\0';
      buffer[0xe0] = '\0';
      buffer[0xe1] = '\0';
      buffer[0xe2] = '\0';
      buffer[0xe3] = '\0';
      buffer[0xe4] = '\0';
      buffer[0xe5] = '\0';
      buffer[0xe6] = '\0';
      buffer[0xe7] = '\0';
      buffer[200] = '\0';
      buffer[0xc9] = '\0';
      buffer[0xca] = '\0';
      buffer[0xcb] = '\0';
      buffer[0xcc] = '\0';
      buffer[0xcd] = '\0';
      buffer[0xce] = '\0';
      buffer[0xcf] = '\0';
      buffer[0xd0] = '\0';
      buffer[0xd1] = '\0';
      buffer[0xd2] = '\0';
      buffer[0xd3] = '\0';
      buffer[0xd4] = '\0';
      buffer[0xd5] = '\0';
      buffer[0xd6] = '\0';
      buffer[0xd7] = '\0';
      buffer[0xb8] = '\0';
      buffer[0xb9] = '\0';
      buffer[0xba] = '\0';
      buffer[0xbb] = '\0';
      buffer[0xbc] = '\0';
      buffer[0xbd] = '\0';
      buffer[0xbe] = '\0';
      buffer[0xbf] = '\0';
      buffer[0xc0] = '\0';
      buffer[0xc1] = '\0';
      buffer[0xc2] = '\0';
      buffer[0xc3] = '\0';
      buffer[0xc4] = '\0';
      buffer[0xc5] = '\0';
      buffer[0xc6] = '\0';
      buffer[199] = '\0';
      buffer[0xa8] = '\0';
      buffer[0xa9] = '\0';
      buffer[0xaa] = '\0';
      buffer[0xab] = '\0';
      buffer[0xac] = '\0';
      buffer[0xad] = '\0';
      buffer[0xae] = '\0';
      buffer[0xaf] = '\0';
      buffer[0xb0] = '\0';
      buffer[0xb1] = '\0';
      buffer[0xb2] = '\0';
      buffer[0xb3] = '\0';
      buffer[0xb4] = '\0';
      buffer[0xb5] = '\0';
      buffer[0xb6] = '\0';
      buffer[0xb7] = '\0';
      buffer[0x98] = '\0';
      buffer[0x99] = '\0';
      buffer[0x9a] = '\0';
      buffer[0x9b] = '\0';
      buffer[0x9c] = '\0';
      buffer[0x9d] = '\0';
      buffer[0x9e] = '\0';
      buffer[0x9f] = '\0';
      buffer[0xa0] = '\0';
      buffer[0xa1] = '\0';
      buffer[0xa2] = '\0';
      buffer[0xa3] = '\0';
      buffer[0xa4] = '\0';
      buffer[0xa5] = '\0';
      buffer[0xa6] = '\0';
      buffer[0xa7] = '\0';
      buffer[0x88] = '\0';
      buffer[0x89] = '\0';
      buffer[0x8a] = '\0';
      buffer[0x8b] = '\0';
      buffer[0x8c] = '\0';
      buffer[0x8d] = '\0';
      buffer[0x8e] = '\0';
      buffer[0x8f] = '\0';
      buffer[0x90] = '\0';
      buffer[0x91] = '\0';
      buffer[0x92] = '\0';
      buffer[0x93] = '\0';
      buffer[0x94] = '\0';
      buffer[0x95] = '\0';
      buffer[0x96] = '\0';
      buffer[0x97] = '\0';
      buffer[0x78] = '\0';
      buffer[0x79] = '\0';
      buffer[0x7a] = '\0';
      buffer[0x7b] = '\0';
      buffer[0x7c] = '\0';
      buffer[0x7d] = '\0';
      buffer[0x7e] = '\0';
      buffer[0x7f] = '\0';
      buffer[0x80] = '\0';
      buffer[0x81] = '\0';
      buffer[0x82] = '\0';
      buffer[0x83] = '\0';
      buffer[0x84] = '\0';
      buffer[0x85] = '\0';
      buffer[0x86] = '\0';
      buffer[0x87] = '\0';
      buffer[0x68] = '\0';
      buffer[0x69] = '\0';
      buffer[0x6a] = '\0';
      buffer[0x6b] = '\0';
      buffer[0x6c] = '\0';
      buffer[0x6d] = '\0';
      buffer[0x6e] = '\0';
      buffer[0x6f] = '\0';
      buffer[0x70] = '\0';
      buffer[0x71] = '\0';
      buffer[0x72] = '\0';
      buffer[0x73] = '\0';
      buffer[0x74] = '\0';
      buffer[0x75] = '\0';
      buffer[0x76] = '\0';
      buffer[0x77] = '\0';
      buffer[0x58] = '\0';
      buffer[0x59] = '\0';
      buffer[0x5a] = '\0';
      buffer[0x5b] = '\0';
      buffer[0x5c] = '\0';
      buffer[0x5d] = '\0';
      buffer[0x5e] = '\0';
      buffer[0x5f] = '\0';
      buffer[0x60] = '\0';
      buffer[0x61] = '\0';
      buffer[0x62] = '\0';
      buffer[99] = '\0';
      buffer[100] = '\0';
      buffer[0x65] = '\0';
      buffer[0x66] = '\0';
      buffer[0x67] = '\0';
      buffer[0x48] = '\0';
      buffer[0x49] = '\0';
      buffer[0x4a] = '\0';
      buffer[0x4b] = '\0';
      buffer[0x4c] = '\0';
      buffer[0x4d] = '\0';
      buffer[0x4e] = '\0';
      buffer[0x4f] = '\0';
      buffer[0x50] = '\0';
      buffer[0x51] = '\0';
      buffer[0x52] = '\0';
      buffer[0x53] = '\0';
      buffer[0x54] = '\0';
      buffer[0x55] = '\0';
      buffer[0x56] = '\0';
      buffer[0x57] = '\0';
      buffer[0x38] = '\0';
      buffer[0x39] = '\0';
      buffer[0x3a] = '\0';
      buffer[0x3b] = '\0';
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x40] = '\0';
      buffer[0x41] = '\0';
      buffer[0x42] = '\0';
      buffer[0x43] = '\0';
      buffer[0x44] = '\0';
      buffer[0x45] = '\0';
      buffer[0x46] = '\0';
      buffer[0x47] = '\0';
      buffer[0x28] = '\0';
      buffer[0x29] = '\0';
      buffer[0x2a] = '\0';
      buffer[0x2b] = '\0';
      buffer[0x2c] = '\0';
      buffer[0x2d] = '\0';
      buffer[0x2e] = '\0';
      buffer[0x2f] = '\0';
      buffer[0x30] = '\0';
      buffer[0x31] = '\0';
      buffer[0x32] = '\0';
      buffer[0x33] = '\0';
      buffer[0x34] = '\0';
      buffer[0x35] = '\0';
      buffer[0x36] = '\0';
      buffer[0x37] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0x20] = '\0';
      buffer[0x21] = '\0';
      buffer[0x22] = '\0';
      buffer[0x23] = '\0';
      buffer[0x24] = '\0';
      buffer[0x25] = '\0';
      buffer[0x26] = '\0';
      buffer[0x27] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      acStack_168[0] = '\0';
      acStack_168[1] = '\0';
      acStack_168[2] = '\0';
      acStack_168[3] = '\0';
      acStack_168[4] = '\0';
      acStack_168[5] = '\0';
      acStack_168[6] = '\0';
      acStack_168[7] = '\0';
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      sprintf(acStack_168,"%d",numItems & 0xffffffff);
      std::__cxx11::string::operator+=((string *)typeStr.field_2._8_8_,acStack_168);
      std::__cxx11::string::operator+=((string *)typeStr.field_2._8_8_,"]");
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string(local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool OpenDDLExport::writeValueType( Value::ValueType type, size_t numItems, std::string &statement ) {
    if ( Value::ddl_types_max == type) {
        return false;
    }

    const std::string typeStr( getTypeToken( type ) );
    statement += typeStr;
    // if we have an array to write
    if ( numItems > 1 ) {
        statement += "[";
        char buffer[ 256 ];
        ::memset( buffer, '\0', 256 * sizeof( char ) );
        sprintf( buffer, "%d", static_cast<int>( numItems ) );
        statement += buffer;
        statement += "]";
    }

    return true;
}